

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddAgent
          (TransitionObservationIndependentMADPDiscrete *this,string *namestring)

{
  string *name_00;
  string *descr_00;
  string *pf_00;
  ostream *poVar1;
  ostream *__x;
  ostream *this_00;
  MultiAgentDecisionProcessDiscrete *this_01;
  string *in_RSI;
  long *in_RDI;
  MultiAgentDecisionProcessDiscrete *m;
  stringstream pf;
  stringstream descr;
  stringstream name;
  Index i;
  MultiAgentDecisionProcess *in_stack_fffffffffffffa38;
  string *this_02;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 uVar2;
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string *in_stack_fffffffffffffaf8;
  MultiAgentDecisionProcess *in_stack_fffffffffffffb00;
  stringstream local_4e0 [16];
  ostream local_4d0 [376];
  stringstream local_358 [16];
  ostream local_348 [376];
  stringstream local_1d0 [16];
  ostream local_1c0 [392];
  string local_38 [36];
  uint local_14;
  string *local_10;
  
  local_10 = in_RSI;
  local_14 = (**(code **)(*in_RDI + 0x10))();
  this_02 = local_38;
  std::__cxx11::string::string(this_02,local_10);
  MultiAgentDecisionProcess::AddAgent(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::__cxx11::stringstream::stringstream(local_358);
  std::__cxx11::stringstream::stringstream(local_4e0);
  name_00 = (string *)std::operator<<(local_1c0,"Indiv.MADPDiscr.Agent");
  std::ostream::operator<<(name_00,local_14);
  descr_00 = (string *)
             std::operator<<(local_348,
                             "The individual MADPDiscrete used to model the transition and observation dynamics for agent "
                            );
  pf_00 = (string *)std::operator<<((ostream *)descr_00,local_10);
  poVar1 = std::operator<<((ostream *)pf_00,"(agent ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,")");
  poVar1 = local_4d0;
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_(in_stack_fffffffffffffa38);
  __x = std::operator<<(poVar1,(string *)&stack0xfffffffffffffb00);
  this_00 = std::operator<<(__x,".agent");
  std::ostream::operator<<(this_00,local_14);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
  this_01 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x208);
  uVar2 = 1;
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::str();
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            ((MultiAgentDecisionProcessDiscrete *)CONCAT17(uVar2,in_stack_fffffffffffffa90),
             (size_t)this_02,(size_t)in_RDI,name_00,descr_00,pf_00);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_528);
  MultiAgentDecisionProcessDiscrete::SetSparse(this_01,(bool)(*(byte *)((long)in_RDI + 0xc9) & 1));
  std::
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::push_back((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
               *)poVar1,(value_type *)__x);
  (**(code **)(*in_RDI + 0x30))(in_RDI,0);
  std::__cxx11::stringstream::~stringstream(local_4e0);
  std::__cxx11::stringstream::~stringstream(local_358);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return;
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddAgent(const string &namestring)
{
    Index i = GetNrAgents();//the old number of agents
    MultiAgentDecisionProcess::AddAgent(namestring);

    stringstream name, descr, pf;
    name << "Indiv.MADPDiscr.Agent"<<i;
    descr << "The individual MADPDiscrete used to model the transition \
and observation dynamics for agent "<<namestring <<"(agent "<<i<<")";
    pf << GetProblemFile() << ".agent" << i;

    MultiAgentDecisionProcessDiscrete* m = new 
        MultiAgentDecisionProcessDiscrete(1, 0, name.str(), descr.str(),
               pf.str() );
    m->SetSparse(_m_sparse);
    _m_individualMADPDs.push_back( m );

    SetInitialized(false);
}